

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_task.cpp
# Opt level: O1

RK_S32 hal_task_get_count(HalTaskGroup group,RK_S32 status)

{
  RK_S32 RVar1;
  
  if (group == (HalTaskGroup)0x0 || 2 < status) {
    _mpp_log_l(2,"hal_task","found invaid input group %p status %d\n","hal_task_get_count",group,
               status);
    RVar1 = -1;
  }
  else {
    mpp_spinlock_lock((spinlock_t *)((long)group + 8));
    RVar1 = *(RK_S32 *)(*(long *)((long)group + 0x30) + (long)status * 4);
    mpp_spinlock_unlock((spinlock_t *)((long)group + 8));
  }
  return RVar1;
}

Assistant:

RK_S32 hal_task_get_count(HalTaskGroup group, RK_S32 status)
{
    if (NULL == group || status >= TASK_BUTT) {
        mpp_err_f("found invaid input group %p status %d\n", group, status);
        return -1;
    }

    HalTaskGroupImpl *p = (HalTaskGroupImpl *)group;
    RK_S32 count;

    mpp_spinlock_lock(&p->lock);
    count = p->count[status];
    mpp_spinlock_unlock(&p->lock);

    return count;
}